

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

bool WindowedKeyTest<Blob<32>,Blob<160>>
               (hashfunc<Blob<160>_> hash,int windowbits,bool testCollision,bool testDistribution,
               bool drawDiagram)

{
  pfHash p_Var1;
  reference pvVar2;
  byte in_CL;
  byte in_DL;
  uint in_ESI;
  byte in_R8B;
  double dVar3;
  int i;
  Blob<32> key;
  int minbit;
  int j;
  int testcount;
  bool result;
  vector<Blob<160>,_std::allocator<Blob<160>_>_> hashes;
  int keycount;
  int keybits;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  undefined6 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff86;
  undefined1 in_stack_ffffffffffffff87;
  vector<Blob<160>,_std::allocator<Blob<160>_>_> *in_stack_ffffffffffffff90;
  vector<Blob<160>,_std::allocator<Blob<160>_>_> *__new_size;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 uVar4;
  Blob<32> local_58;
  int local_54;
  vector<Blob<160>,_std::allocator<Blob<160>_>_> local_50;
  vector<Blob<160>,_std::allocator<Blob<160>_>_> local_30;
  uint local_18;
  undefined4 local_14;
  byte local_f;
  byte local_e;
  byte local_d;
  uint local_c;
  hashfunc local_8 [8];
  
  local_d = in_DL & 1;
  local_e = in_CL & 1;
  local_f = in_R8B & 1;
  local_14 = 0x20;
  local_18 = 1 << ((byte)in_ESI & 0x1f);
  local_c = in_ESI;
  while( true ) {
    dVar3 = EstimateNbCollisions
                      ((int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                       (int)in_stack_ffffffffffffff90);
    uVar4 = dVar3 < 0.5 && (int)local_c < 0x19;
    if ((dVar3 >= 0.5 || (int)local_c >= 0x19) ||
       (dVar3 = log2((double)(int)local_18 * 2.0), (int)dVar3 < 0)) break;
    local_18 = local_18 << 1;
    dVar3 = log2((double)(int)local_18 * 1.0);
    local_c = (uint)dVar3;
  }
  __new_size = &local_30;
  std::vector<Blob<160>,_std::allocator<Blob<160>_>_>::vector
            ((vector<Blob<160>,_std::allocator<Blob<160>_>_> *)0x17545c);
  std::vector<Blob<160>,_std::allocator<Blob<160>_>_>::resize
            ((vector<Blob<160>,_std::allocator<Blob<160>_>_> *)
             CONCAT17(uVar4,in_stack_ffffffffffffffa0),(size_type)__new_size);
  local_50.super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
  local_50.super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ = 0x20;
  printf("Keyset \'Window\' - %3d-bit key, %3d-bit window - %d tests, %d keys per test\n",0x20,
         (ulong)local_c,0x20,(ulong)local_18);
  for (local_50.super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>._M_impl.
       super__Vector_impl_data._M_finish._0_4_ = 0;
      (int)(uint)local_50.super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>._M_impl.
                 super__Vector_impl_data._M_finish <=
      local_50.super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>._M_impl.
      super__Vector_impl_data._M_finish._4_4_;
      local_50.super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ =
           (uint)local_50.super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1) {
    local_50.super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>._M_impl.
    super__Vector_impl_data._M_start._4_4_ =
         (uint)local_50.super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>._M_impl.
               super__Vector_impl_data._M_finish;
    Blob<32>::Blob((Blob<32> *)&local_50);
    for (local_54 = 0; local_54 < (int)local_18; local_54 = local_54 + 1) {
      Blob<32>::Blob(&local_58,local_54);
      in_stack_ffffffffffffff90 = &local_50;
      Blob<32>::operator=((Blob<32> *)in_stack_ffffffffffffff90,&local_58);
      lrot((void *)CONCAT17(in_stack_ffffffffffffff87,
                            CONCAT16(in_stack_ffffffffffffff86,in_stack_ffffffffffffff80)),
           in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
      p_Var1 = hashfunc::operator_cast_to_function_pointer(local_8);
      pvVar2 = std::vector<Blob<160>,_std::allocator<Blob<160>_>_>::operator[]
                         (&local_30,(long)local_54);
      (*p_Var1)(&local_50,4,0,pvVar2);
    }
    printf("Window at %3d - ",
           (ulong)(uint)local_50.super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>._M_impl.
                        super__Vector_impl_data._M_finish);
    in_stack_ffffffffffffff87 =
         TestHashList<Blob<160>>
                   (_keycount,
                    hashes.super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._7_1_,
                    hashes.super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._6_1_,
                    hashes.super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._5_1_,
                    hashes.super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._4_1_,
                    hashes.super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._3_1_);
    local_50.super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._3_1_ =
         (local_50.super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._3_1_ & 1 & in_stack_ffffffffffffff87) != 0;
  }
  std::vector<Blob<160>,_std::allocator<Blob<160>_>_>::~vector(in_stack_ffffffffffffff90);
  return (bool)(local_50.super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._3_1_ & 1);
}

Assistant:

bool WindowedKeyTest ( hashfunc<hashtype> hash, int windowbits,
                       bool testCollision, bool testDistribution, bool drawDiagram )
{
  const int keybits = sizeof(keytype) * 8;
  // calc keycount to expect min. 0.5 collisions: EstimateNbCollisions, except for 64++bit.
  // there limit to 2^25 = 33554432 keys
  int keycount = 1 << windowbits;
  while (EstimateNbCollisions(keycount, sizeof(hashtype) * 8) < 0.5 && windowbits < 25) {
    if ((int)log2(2.0 * keycount) < 0) // overflow
      break;
    keycount *= 2;
    windowbits = (int)log2(1.0 * keycount);
    //printf (" enlarge windowbits to %d (%d keys)\n", windowbits, keycount);
    //fflush (NULL);
  }

  std::vector<hashtype> hashes;
  hashes.resize(keycount);

  bool result = true;
  int testcount = keybits;

  printf("Keyset 'Window' - %3d-bit key, %3d-bit window - %d tests, %d keys per test\n",
         keybits,windowbits,testcount,keycount);

  for(int j = 0; j <= testcount; j++)
  {
    int minbit = j;
    keytype key;

    for(int i = 0; i < keycount; i++)
    {
      key = i;
      //key = key << minbit;
      lrot(&key,sizeof(keytype),minbit);
      hash(&key,sizeof(keytype),0,&hashes[i]);
    }

    printf("Window at %3d - ",j);
    result &= TestHashList(hashes, drawDiagram, testCollision, testDistribution,
                           /* do not test high/low bits (to not clobber the screen) */
                           false, false);
    //printf("\n");
  }

  return result;
}